

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall
re2::RE2::CapturingGroupNames::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,RE2 *re)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  long in_RSI;
  Regexp *in_stack_00000030;
  
  if (*(long *)(in_RSI + 0x68) != 0) {
    pmVar1 = Regexp::CaptureNames_abi_cxx11_(in_stack_00000030);
    *(map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      **)(in_RSI + 0xc0) = pmVar1;
  }
  if (*(long *)(in_RSI + 0xc0) == 0) {
    *(undefined8 *)(in_RSI + 0xc0) = empty_group_names_abi_cxx11_;
  }
  return;
}

Assistant:

const std::map<int, std::string>& RE2::CapturingGroupNames() const {
  std::call_once(group_names_once_, [](const RE2* re) {
    if (re->suffix_regexp_ != NULL)
      re->group_names_ = re->suffix_regexp_->CaptureNames();
    if (re->group_names_ == NULL)
      re->group_names_ = empty_group_names;
  }, this);
  return *group_names_;
}